

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::moveToolBar(QMainWindowLayout *this,QToolBar *toolbar,int pos)

{
  bool bVar1;
  undefined4 in_EDX;
  QToolBarAreaLayout *in_RSI;
  long *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  QToolBarAreaLayout::moveToolBar
            (in_RSI,(QToolBar *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
             (int)((ulong)in_RDI >> 0x20));
  bVar1 = QMainWindowLayoutState::isValid((QMainWindowLayoutState *)0x5f600a);
  if (bVar1) {
    QToolBarAreaLayout::moveToolBar
              (in_RSI,(QToolBar *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               (int)((ulong)in_RDI >> 0x20));
  }
  (**(code **)(*in_RDI + 0x70))();
  return;
}

Assistant:

void QMainWindowLayout::moveToolBar(QToolBar *toolbar, int pos)
{
    layoutState.toolBarAreaLayout.moveToolBar(toolbar, pos);
    if (savedState.isValid())
        savedState.toolBarAreaLayout.moveToolBar(toolbar, pos);
    invalidate();
}